

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_header.cpp
# Opt level: O2

bool __thiscall BamTools::HeaderTool::HeaderToolPrivate::Run(HeaderToolPrivate *this)

{
  char cVar1;
  bool bVar2;
  string *__x;
  istream *piVar3;
  ostream *poVar4;
  HeaderSettings *pHVar5;
  BamMultiReader reader;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  ifstream filelist;
  
  pHVar5 = this->m_settings;
  if ((pHVar5->HasInput == false) && (pHVar5->HasInputFilelist == false)) {
    __x = Options::StandardIn_abi_cxx11_();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&pHVar5->InputFiles,__x);
    pHVar5 = this->m_settings;
  }
  if (pHVar5->HasInputFilelist == true) {
    std::ifstream::ifstream(&filelist,(pHVar5->InputFilelist)._M_dataplus._M_p,_S_in);
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 == '\0') {
      poVar4 = std::operator<<((ostream *)&std::cerr,
                               "bamtools header ERROR: could not open input BAM file list... Aborting."
                              );
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    else {
      reader.d = (BamMultiReaderPrivate *)&local_238;
      local_238._M_local_buf[0] = '\0';
      while (piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                ((istream *)&filelist,(string *)&reader),
            ((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) == 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->m_settings->InputFiles,(value_type *)&reader);
      }
      std::__cxx11::string::~string((string *)&reader);
    }
    std::ifstream::~ifstream(&filelist);
    if (cVar1 == '\0') {
      return false;
    }
  }
  BamMultiReader::BamMultiReader(&reader);
  bVar2 = BamMultiReader::Open(&reader,&this->m_settings->InputFiles);
  if (bVar2) {
    BamMultiReader::GetHeaderText_abi_cxx11_((string *)&filelist,&reader);
    poVar4 = std::operator<<((ostream *)&std::cout,(string *)&filelist);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::string::~string((string *)&filelist);
    BamMultiReader::Close(&reader);
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cerr,
                             "bamtools header ERROR: could not open BAM file(s) for reading... Aborting."
                            );
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  BamMultiReader::~BamMultiReader(&reader);
  return bVar2;
}

Assistant:

bool HeaderTool::HeaderToolPrivate::Run()
{

    // set to default input if none provided
    if (!m_settings->HasInput && !m_settings->HasInputFilelist)
        m_settings->InputFiles.push_back(Options::StandardIn());

    // add files in the filelist to the input file list
    if (m_settings->HasInputFilelist) {

        std::ifstream filelist(m_settings->InputFilelist.c_str(), std::ios::in);
        if (!filelist.is_open()) {
            std::cerr << "bamtools header ERROR: could not open input BAM file list... Aborting."
                      << std::endl;
            return false;
        }

        std::string line;
        while (std::getline(filelist, line))
            m_settings->InputFiles.push_back(line);
    }

    // attemp to open BAM files
    BamMultiReader reader;
    if (!reader.Open(m_settings->InputFiles)) {
        std::cerr << "bamtools header ERROR: could not open BAM file(s) for reading... Aborting."
                  << std::endl;
        return false;
    }

    // dump (merged) header contents to stdout
    std::cout << reader.GetHeaderText() << std::endl;

    // clean up & exit
    reader.Close();
    return true;
}